

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O2

idx_t __thiscall
duckdb::ColumnData::ScanVector
          (ColumnData *this,TransactionData transaction,idx_t vector_index,ColumnScanState *state,
          Vector *result,idx_t target_scan,ScanVectorType scan_type,ScanVectorMode mode)

{
  idx_t scan_count;
  
  scan_count = ScanVector(this,state,result,target_scan,scan_type,0);
  if (scan_type != SCAN_ENTIRE_VECTOR) {
    FetchUpdates(this,transaction,vector_index,result,scan_count,mode != SCAN_COMMITTED_NO_UPDATES,
                 mode != REGULAR_SCAN);
  }
  return scan_count;
}

Assistant:

idx_t ColumnData::ScanVector(TransactionData transaction, idx_t vector_index, ColumnScanState &state, Vector &result,
                             idx_t target_scan, ScanVectorType scan_type, ScanVectorMode mode) {
	auto scan_count = ScanVector(state, result, target_scan, scan_type);
	if (scan_type != ScanVectorType::SCAN_ENTIRE_VECTOR) {
		// if we are scanning an entire vector we cannot have updates
		bool allow_updates = mode != ScanVectorMode::SCAN_COMMITTED_NO_UPDATES;
		bool scan_committed = mode != ScanVectorMode::REGULAR_SCAN;
		FetchUpdates(transaction, vector_index, result, scan_count, allow_updates, scan_committed);
	}
	return scan_count;
}